

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool LargeIntRegMultiply<long,_long>::RegMultiply(int64_t *a,int64_t *b,int64_t *pRet)

{
  uint64_t uVar1;
  bool bVar2;
  ulong uVar3;
  ulong *in_RDX;
  uint64_t *in_RSI;
  uint64_t *in_RDI;
  int64_t b1;
  int64_t a1;
  uint64_t tmp;
  bool bNegative;
  bool aNegative;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  uint64_t local_30;
  byte local_22;
  byte local_21;
  ulong *local_20;
  
  local_21 = 0;
  local_22 = 0;
  local_30 = 0;
  local_38 = *in_RDI;
  local_40 = *in_RSI;
  local_20 = in_RDX;
  if ((long)local_38 < 0) {
    local_21 = 1;
    local_38 = AbsValueHelper<long,_1>::Abs(0x1b29a7);
  }
  if ((long)local_40 < 0) {
    local_22 = 1;
    local_40 = AbsValueHelper<long,_1>::Abs(0x1b29c3);
  }
  local_48 = local_38;
  local_50 = local_40;
  bVar2 = LargeIntRegMultiply<unsigned_long,_unsigned_long>::RegMultiply
                    (&local_48,&local_50,&local_30);
  uVar1 = local_30;
  if (bVar2) {
    if ((local_21 & 1) == (local_22 & 1)) {
      uVar3 = std::numeric_limits<long>::max();
      if (uVar1 <= uVar3) {
        *local_20 = local_30;
        return true;
      }
    }
    else {
      uVar3 = std::numeric_limits<long>::min();
      if (uVar1 <= uVar3) {
        uVar3 = SignedNegation<long>::Value(local_30);
        *local_20 = uVar3;
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool RegMultiply( const std::int64_t& a, const std::int64_t& b, std::int64_t* pRet ) SAFEINT_NOTHROW
    {
#if SAFEINT_USE_INTRINSICS || SAFEINT_HAS_INT128
        return MultiplyInt64( a, b, pRet );
#else
        bool aNegative = false;
        bool bNegative = false;

        std::uint64_t tmp = 0;
        std::int64_t a1 = a;
        std::int64_t b1 = b;

        if( a1 < 0 )
        {
            aNegative = true;
            a1 = (std::int64_t)AbsValueHelper< std::int64_t, GetAbsMethod< std::int64_t >::method >::Abs(a1);
        }

        if( b1 < 0 )
        {
            bNegative = true;
            b1 = (std::int64_t)AbsValueHelper< std::int64_t, GetAbsMethod< std::int64_t >::method >::Abs(b1);
        }

        if( LargeIntRegMultiply< std::uint64_t, std::uint64_t >::RegMultiply( (std::uint64_t)a1, (std::uint64_t)b1, &tmp ) )
        {
            // The unsigned multiplication didn't overflow
            if( aNegative ^ bNegative )
            {
                // Result must be negative
                if( tmp <= (std::uint64_t)std::numeric_limits< std::int64_t >::min() )
                {
                    *pRet = SignedNegation< std::int64_t >::Value( tmp );
                    return true;
                }
            }
            else
            {
                // Result must be positive
                if( tmp <= (std::uint64_t)std::numeric_limits<std::int64_t>::max() )
                {
                    *pRet = (std::int64_t)tmp;
                    return true;
                }
            }
        }

        return false;
#endif
    }